

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O3

Coroutine * __thiscall
squall::TableBase::co_call<int,int,int,int>
          (Coroutine *__return_storage_ptr__,TableBase *this,string *name,int args,int args_1,
          int args_2,int args_3)

{
  HSQUIRRELVM v;
  SQInteger SVar1;
  
  SVar1 = sq_gettop(this->vm_);
  detail::call_setup<int,int,int,int>(this->vm_,&this->tableobj_,name,args,args_1,args_2,args_3);
  v = this->vm_;
  __return_storage_ptr__->vm_ = v;
  __return_storage_ptr__->top_ = SVar1;
  SVar1 = sq_getvmstate(v);
  __return_storage_ptr__->suspended_ = SVar1 == 2;
  return __return_storage_ptr__;
}

Assistant:

Coroutine co_call(const string& name, T... args) {
        SQInteger top = sq_gettop(handle());
        detail::call_setup(vm_, tableobj_, name, args...);
        return Coroutine(vm_, top);
    }